

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  stbi__zhuffman *z;
  stbi_uc *psVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  byte *pbVar10;
  long lVar11;
  stbi_uc *psVar12;
  int iVar13;
  stbi_uc sVar14;
  ulong uVar15;
  long lVar16;
  stbi__uint32 sVar17;
  stbi__uint32 sVar18;
  uint uVar19;
  char *pcVar20;
  int iVar21;
  ulong uVar22;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  undefined8 local_a08;
  undefined7 uStack_a00;
  undefined4 uStack_9f9;
  byte bStack_9e9;
  stbi_uc local_9e8 [468];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header != 0) {
    pbVar10 = a->zbuffer;
    uVar6 = 0;
    if (pbVar10 < a->zbuffer_end) {
      a->zbuffer = pbVar10 + 1;
      uVar2 = (uint)*pbVar10;
      pbVar10 = pbVar10 + 1;
    }
    else {
      uVar2 = 0;
    }
    if (pbVar10 < a->zbuffer_end) {
      a->zbuffer = pbVar10 + 1;
      uVar6 = (uint)*pbVar10;
    }
    if ((((uVar6 & 0x20) != 0) ||
        (uVar6 = uVar6 | uVar2 << 8, uVar8 = uVar6 * 0x843 >> 0x10,
        (short)((short)(((uVar6 - uVar8 & 0xffff) >> 1) + uVar8 >> 4) * -0x1f + (short)uVar6) != 0))
       || ((uVar2 & 0xf) != 8)) {
LAB_00104b2f:
      stbi__g_failure_reason = "Corrupt PNG";
switchD_001042a4_caseD_3:
      return 0;
    }
  }
  a->num_bits = 0;
  a->code_buffer = 0;
  z = &a->z_distance;
  iVar9 = 0;
  do {
    if (iVar9 < 1) {
      stbi__fill_bits(a);
      iVar9 = a->num_bits;
    }
    uVar6 = a->code_buffer;
    sVar17 = uVar6 >> 1;
    a->code_buffer = sVar17;
    iVar3 = iVar9 + -1;
    a->num_bits = iVar3;
    if (iVar9 < 3) {
      stbi__fill_bits(a);
      iVar3 = a->num_bits;
      sVar17 = a->code_buffer;
    }
    sVar18 = sVar17 >> 2;
    a->code_buffer = sVar18;
    uVar2 = iVar3 - 2;
    a->num_bits = uVar2;
    switch(sVar17 & 3) {
    case 0:
      uVar8 = uVar2 & 7;
      if (uVar8 != 0) {
        if (iVar3 < 2) {
          stbi__fill_bits(a);
          uVar2 = a->num_bits;
          sVar18 = a->code_buffer;
        }
        sVar18 = sVar18 >> (sbyte)uVar8;
        a->code_buffer = sVar18;
        uVar2 = uVar2 - uVar8;
        a->num_bits = uVar2;
      }
      if ((int)uVar2 < 1) {
        if (uVar2 != 0) goto LAB_00104b77;
        uVar22 = 0;
LAB_00104a7f:
        psVar12 = a->zbuffer;
        psVar1 = a->zbuffer_end;
        do {
          if (psVar12 < psVar1) {
            a->zbuffer = psVar12 + 1;
            sVar14 = *psVar12;
            psVar12 = psVar12 + 1;
          }
          else {
            sVar14 = '\0';
          }
          *(stbi_uc *)((long)local_814.fast + uVar22) = sVar14;
          uVar22 = uVar22 + 1;
        } while (uVar22 != 4);
      }
      else {
        uVar8 = uVar2 - 1 >> 3;
        uVar22 = (ulong)(uVar8 + 1);
        uVar15 = 0xffffffffffffffff;
        do {
          *(char *)((long)local_814.fast + uVar15 + 1) = (char)sVar18;
          sVar18 = sVar18 >> 8;
          uVar15 = uVar15 + 1;
        } while (uVar8 != uVar15);
        a->code_buffer = sVar18;
        iVar9 = (uVar2 - 8) - (uVar2 - 1 & 0xfffffff8);
        a->num_bits = iVar9;
        if (iVar9 != 0) {
LAB_00104b77:
          __assert_fail("a->num_bits == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/RayTracing[P]raytracing/src/external/stb_image.h"
                        ,0xe8e,"int stbi__parse_uncomperssed_block(stbi__zbuf *)");
        }
        if (uVar15 < 3) goto LAB_00104a7f;
      }
      if ((local_814.fast[1] ^ local_814.fast[0]) == 0xffff) {
        psVar12 = a->zbuffer;
        uVar22 = (ulong)local_814.fast[0];
        if (psVar12 + uVar22 <= a->zbuffer_end) {
          pcVar20 = a->zout;
          if (a->zout_end < pcVar20 + uVar22) {
            iVar9 = stbi__zexpand(a,pcVar20,(uint)local_814.fast[0]);
            if (iVar9 == 0) {
              return 0;
            }
            psVar12 = a->zbuffer;
            pcVar20 = a->zout;
          }
          memcpy(pcVar20,psVar12,uVar22);
          a->zbuffer = a->zbuffer + uVar22;
          a->zout = a->zout + uVar22;
          goto LAB_00104b19;
        }
      }
      goto LAB_00104b2f;
    case 1:
      if (stbi__zdefault_distance[0x1f] == '\0') {
        memset(stbi__zdefault_length,8,0x90);
        builtin_memcpy(stbi__zdefault_length + 0x90,
                       "\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                       ,0x90);
        builtin_memcpy(stbi__zdefault_distance,
                       "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
                       ,0x20);
      }
      iVar9 = stbi__zbuild_huffman(&a->z_length,stbi__zdefault_length,0x120);
      if (iVar9 == 0) {
        return 0;
      }
      iVar9 = stbi__zbuild_huffman(z,stbi__zdefault_distance,0x20);
      break;
    case 2:
      if (iVar3 < 7) {
        stbi__fill_bits(a);
        uVar2 = a->num_bits;
        sVar18 = a->code_buffer;
      }
      uVar8 = sVar18 >> 5;
      a->code_buffer = uVar8;
      iVar9 = uVar2 - 5;
      a->num_bits = iVar9;
      if ((int)uVar2 < 10) {
        stbi__fill_bits(a);
        iVar9 = a->num_bits;
        uVar8 = a->code_buffer;
      }
      uVar2 = uVar8 >> 5;
      a->code_buffer = uVar2;
      iVar3 = iVar9 + -5;
      a->num_bits = iVar3;
      if (iVar9 < 9) {
        stbi__fill_bits(a);
        iVar3 = a->num_bits;
        uVar2 = a->code_buffer;
      }
      uVar19 = (sVar18 & 0x1f) + 0x101;
      iVar9 = (uVar8 & 0x1f) + 1;
      uVar8 = uVar2 >> 4;
      a->code_buffer = uVar8;
      iVar3 = iVar3 + -4;
      a->num_bits = iVar3;
      local_a08 = 0;
      uStack_a00 = 0;
      uStack_9f9 = 0;
      uVar22 = 0;
      do {
        uVar7 = uVar8;
        if (iVar3 < 3) {
          stbi__fill_bits(a);
          iVar3 = a->num_bits;
          uVar7 = a->code_buffer;
        }
        uVar8 = uVar7 >> 3;
        a->code_buffer = uVar8;
        iVar3 = iVar3 + -3;
        a->num_bits = iVar3;
        *(byte *)((long)&local_a08 +
                 (ulong)(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[uVar22])
             = (byte)uVar7 & 7;
        uVar22 = uVar22 + 1;
      } while ((uVar2 & 0xf) + 4 != uVar22);
      iVar3 = stbi__zbuild_huffman(&local_814,(stbi_uc *)&local_a08,0x13);
      if (iVar3 == 0) {
        return 0;
      }
      iVar21 = iVar9 + uVar19;
      iVar3 = a->num_bits;
      iVar13 = 0;
      do {
        if (iVar3 < 0x10) {
          stbi__fill_bits(a);
        }
        uVar2 = a->code_buffer;
        uVar5 = local_814.fast[uVar2 & 0x1ff];
        if (uVar5 == 0) {
          uVar5 = (ushort)uVar2 << 8 | (ushort)uVar2 >> 8;
          uVar8 = (uVar5 & 0xf0f) << 4 | (uVar5 & 0xf0f0) >> 4;
          uVar8 = (uVar8 >> 2 & 0x3333) + (uVar8 & 0x3333) * 4;
          uVar8 = (uVar8 >> 1 & 0x5555) + (uVar8 & 0x5555) * 2;
          lVar4 = 0;
          do {
            lVar11 = lVar4;
            lVar4 = lVar11 + 1;
          } while (local_814.maxcode[lVar11 + 10] <= (int)uVar8);
          if (lVar4 == 7) goto LAB_00104b2f;
          lVar16 = (ulong)local_814.firstsymbol[lVar11 + 10] +
                   ((ulong)(uVar8 >> (7U - (char)lVar4 & 0x1f)) -
                   (ulong)local_814.firstcode[lVar11 + 10]);
          if ((ulong)*(byte *)((long)&local_814 + lVar16 + 0x484) - 9 != lVar4) goto LAB_00104b58;
          uVar2 = uVar2 >> ((char)lVar11 + 10U & 0x1f);
          a->code_buffer = uVar2;
          iVar3 = (a->num_bits - (int)lVar4) + -9;
          a->num_bits = iVar3;
          uVar5 = *(ushort *)((long)&local_814 + lVar16 * 2 + 0x5a4);
        }
        else {
          uVar2 = uVar2 >> ((byte)(uVar5 >> 9) & 0x1f);
          a->code_buffer = uVar2;
          iVar3 = a->num_bits - (uint)(uVar5 >> 9);
          a->num_bits = iVar3;
          uVar5 = uVar5 & 0x1ff;
        }
        if (0x12 < uVar5) goto LAB_00104b2f;
        if (uVar5 < 0x10) {
          lVar4 = (long)iVar13;
          iVar13 = iVar13 + 1;
          local_9e8[lVar4] = (char)uVar5;
        }
        else {
          if (uVar5 == 0x11) {
            if (iVar3 < 3) {
              stbi__fill_bits(a);
              iVar3 = a->num_bits;
              uVar2 = a->code_buffer;
            }
            uVar8 = uVar2 & 7;
            a->code_buffer = uVar2 >> 3;
            iVar3 = iVar3 + -3;
            a->num_bits = iVar3;
            uVar2 = 0;
          }
          else {
            if (uVar5 != 0x10) {
              if (iVar3 < 7) {
                stbi__fill_bits(a);
                iVar3 = a->num_bits;
                uVar2 = a->code_buffer;
              }
              a->code_buffer = uVar2 >> 7;
              iVar3 = iVar3 + -7;
              a->num_bits = iVar3;
              memset(local_9e8 + iVar13,0,(ulong)((uVar2 & 0x7f) + 0xb));
              iVar13 = iVar13 + (uVar2 & 0x7f) + 0xb;
              goto LAB_001046eb;
            }
            if (iVar3 < 2) {
              stbi__fill_bits(a);
              iVar3 = a->num_bits;
              uVar2 = a->code_buffer;
            }
            uVar8 = uVar2 & 3;
            a->code_buffer = uVar2 >> 2;
            iVar3 = iVar3 + -2;
            a->num_bits = iVar3;
            uVar2 = (uint)(&bStack_9e9)[iVar13];
          }
          memset(local_9e8 + iVar13,uVar2,(ulong)(uVar8 + 3));
          iVar13 = iVar13 + uVar8 + 3;
        }
LAB_001046eb:
      } while (iVar13 < iVar21);
      if (iVar13 != iVar21) goto LAB_00104b2f;
      iVar3 = stbi__zbuild_huffman(&a->z_length,local_9e8,uVar19);
      if (iVar3 == 0) {
        return 0;
      }
      iVar9 = stbi__zbuild_huffman(z,local_9e8 + uVar19,iVar9);
      break;
    case 3:
      goto switchD_001042a4_caseD_3;
    }
    if (iVar9 == 0) {
      stbi__zdefault_distance[0] = (stbi_uc)stbi__zdefault_distance._0_8_;
      stbi__zdefault_distance[1] = SUB81(stbi__zdefault_distance._0_8_,1);
      stbi__zdefault_distance[2] = SUB81(stbi__zdefault_distance._0_8_,2);
      stbi__zdefault_distance[3] = SUB81(stbi__zdefault_distance._0_8_,3);
      stbi__zdefault_distance[4] = SUB81(stbi__zdefault_distance._0_8_,4);
      stbi__zdefault_distance[5] = SUB81(stbi__zdefault_distance._0_8_,5);
      stbi__zdefault_distance[6] = SUB81(stbi__zdefault_distance._0_8_,6);
      stbi__zdefault_distance[7] = SUB81(stbi__zdefault_distance._0_8_,7);
      stbi__zdefault_distance[8] = (stbi_uc)stbi__zdefault_distance._8_8_;
      stbi__zdefault_distance[9] = SUB81(stbi__zdefault_distance._8_8_,1);
      stbi__zdefault_distance[10] = SUB81(stbi__zdefault_distance._8_8_,2);
      stbi__zdefault_distance[0xb] = SUB81(stbi__zdefault_distance._8_8_,3);
      stbi__zdefault_distance[0xc] = SUB81(stbi__zdefault_distance._8_8_,4);
      stbi__zdefault_distance[0xd] = SUB81(stbi__zdefault_distance._8_8_,5);
      stbi__zdefault_distance[0xe] = SUB81(stbi__zdefault_distance._8_8_,6);
      stbi__zdefault_distance[0xf] = SUB81(stbi__zdefault_distance._8_8_,7);
      stbi__zdefault_distance[0x10] = (stbi_uc)stbi__zdefault_distance._16_8_;
      stbi__zdefault_distance[0x11] = SUB81(stbi__zdefault_distance._16_8_,1);
      stbi__zdefault_distance[0x12] = SUB81(stbi__zdefault_distance._16_8_,2);
      stbi__zdefault_distance[0x13] = SUB81(stbi__zdefault_distance._16_8_,3);
      stbi__zdefault_distance[0x14] = SUB81(stbi__zdefault_distance._16_8_,4);
      stbi__zdefault_distance[0x15] = SUB81(stbi__zdefault_distance._16_8_,5);
      stbi__zdefault_distance[0x16] = SUB81(stbi__zdefault_distance._16_8_,6);
      stbi__zdefault_distance[0x17] = SUB81(stbi__zdefault_distance._16_8_,7);
      stbi__zdefault_distance[0x18] = (stbi_uc)stbi__zdefault_distance._24_8_;
      stbi__zdefault_distance[0x19] = SUB81(stbi__zdefault_distance._24_8_,1);
      stbi__zdefault_distance[0x1a] = SUB81(stbi__zdefault_distance._24_8_,2);
      stbi__zdefault_distance[0x1b] = SUB81(stbi__zdefault_distance._24_8_,3);
      stbi__zdefault_distance[0x1c] = SUB81(stbi__zdefault_distance._24_8_,4);
      stbi__zdefault_distance[0x1d] = SUB81(stbi__zdefault_distance._24_8_,5);
      stbi__zdefault_distance[0x1e] = SUB81(stbi__zdefault_distance._24_8_,6);
      stbi__zdefault_distance[0x1f] = SUB81(stbi__zdefault_distance._24_8_,7);
      stbi__zdefault_length[0x90] = (stbi_uc)stbi__zdefault_length._144_8_;
      stbi__zdefault_length[0x91] = SUB81(stbi__zdefault_length._144_8_,1);
      stbi__zdefault_length[0x92] = SUB81(stbi__zdefault_length._144_8_,2);
      stbi__zdefault_length[0x93] = SUB81(stbi__zdefault_length._144_8_,3);
      stbi__zdefault_length[0x94] = SUB81(stbi__zdefault_length._144_8_,4);
      stbi__zdefault_length[0x95] = SUB81(stbi__zdefault_length._144_8_,5);
      stbi__zdefault_length[0x96] = SUB81(stbi__zdefault_length._144_8_,6);
      stbi__zdefault_length[0x97] = SUB81(stbi__zdefault_length._144_8_,7);
      stbi__zdefault_length[0x98] = (stbi_uc)stbi__zdefault_length._152_8_;
      stbi__zdefault_length[0x99] = SUB81(stbi__zdefault_length._152_8_,1);
      stbi__zdefault_length[0x9a] = SUB81(stbi__zdefault_length._152_8_,2);
      stbi__zdefault_length[0x9b] = SUB81(stbi__zdefault_length._152_8_,3);
      stbi__zdefault_length[0x9c] = SUB81(stbi__zdefault_length._152_8_,4);
      stbi__zdefault_length[0x9d] = SUB81(stbi__zdefault_length._152_8_,5);
      stbi__zdefault_length[0x9e] = SUB81(stbi__zdefault_length._152_8_,6);
      stbi__zdefault_length[0x9f] = SUB81(stbi__zdefault_length._152_8_,7);
      stbi__zdefault_length[0xa0] = (stbi_uc)stbi__zdefault_length._160_8_;
      stbi__zdefault_length[0xa1] = SUB81(stbi__zdefault_length._160_8_,1);
      stbi__zdefault_length[0xa2] = SUB81(stbi__zdefault_length._160_8_,2);
      stbi__zdefault_length[0xa3] = SUB81(stbi__zdefault_length._160_8_,3);
      stbi__zdefault_length[0xa4] = SUB81(stbi__zdefault_length._160_8_,4);
      stbi__zdefault_length[0xa5] = SUB81(stbi__zdefault_length._160_8_,5);
      stbi__zdefault_length[0xa6] = SUB81(stbi__zdefault_length._160_8_,6);
      stbi__zdefault_length[0xa7] = SUB81(stbi__zdefault_length._160_8_,7);
      stbi__zdefault_length[0xa8] = (stbi_uc)stbi__zdefault_length._168_8_;
      stbi__zdefault_length[0xa9] = SUB81(stbi__zdefault_length._168_8_,1);
      stbi__zdefault_length[0xaa] = SUB81(stbi__zdefault_length._168_8_,2);
      stbi__zdefault_length[0xab] = SUB81(stbi__zdefault_length._168_8_,3);
      stbi__zdefault_length[0xac] = SUB81(stbi__zdefault_length._168_8_,4);
      stbi__zdefault_length[0xad] = SUB81(stbi__zdefault_length._168_8_,5);
      stbi__zdefault_length[0xae] = SUB81(stbi__zdefault_length._168_8_,6);
      stbi__zdefault_length[0xaf] = SUB81(stbi__zdefault_length._168_8_,7);
      stbi__zdefault_length[0xb0] = (stbi_uc)stbi__zdefault_length._176_8_;
      stbi__zdefault_length[0xb1] = SUB81(stbi__zdefault_length._176_8_,1);
      stbi__zdefault_length[0xb2] = SUB81(stbi__zdefault_length._176_8_,2);
      stbi__zdefault_length[0xb3] = SUB81(stbi__zdefault_length._176_8_,3);
      stbi__zdefault_length[0xb4] = SUB81(stbi__zdefault_length._176_8_,4);
      stbi__zdefault_length[0xb5] = SUB81(stbi__zdefault_length._176_8_,5);
      stbi__zdefault_length[0xb6] = SUB81(stbi__zdefault_length._176_8_,6);
      stbi__zdefault_length[0xb7] = SUB81(stbi__zdefault_length._176_8_,7);
      stbi__zdefault_length[0xb8] = (stbi_uc)stbi__zdefault_length._184_8_;
      stbi__zdefault_length[0xb9] = SUB81(stbi__zdefault_length._184_8_,1);
      stbi__zdefault_length[0xba] = SUB81(stbi__zdefault_length._184_8_,2);
      stbi__zdefault_length[0xbb] = SUB81(stbi__zdefault_length._184_8_,3);
      stbi__zdefault_length[0xbc] = SUB81(stbi__zdefault_length._184_8_,4);
      stbi__zdefault_length[0xbd] = SUB81(stbi__zdefault_length._184_8_,5);
      stbi__zdefault_length[0xbe] = SUB81(stbi__zdefault_length._184_8_,6);
      stbi__zdefault_length[0xbf] = SUB81(stbi__zdefault_length._184_8_,7);
      stbi__zdefault_length[0xc0] = (stbi_uc)stbi__zdefault_length._192_8_;
      stbi__zdefault_length[0xc1] = SUB81(stbi__zdefault_length._192_8_,1);
      stbi__zdefault_length[0xc2] = SUB81(stbi__zdefault_length._192_8_,2);
      stbi__zdefault_length[0xc3] = SUB81(stbi__zdefault_length._192_8_,3);
      stbi__zdefault_length[0xc4] = SUB81(stbi__zdefault_length._192_8_,4);
      stbi__zdefault_length[0xc5] = SUB81(stbi__zdefault_length._192_8_,5);
      stbi__zdefault_length[0xc6] = SUB81(stbi__zdefault_length._192_8_,6);
      stbi__zdefault_length[199] = SUB81(stbi__zdefault_length._192_8_,7);
      stbi__zdefault_length[200] = (stbi_uc)stbi__zdefault_length._200_8_;
      stbi__zdefault_length[0xc9] = SUB81(stbi__zdefault_length._200_8_,1);
      stbi__zdefault_length[0xca] = SUB81(stbi__zdefault_length._200_8_,2);
      stbi__zdefault_length[0xcb] = SUB81(stbi__zdefault_length._200_8_,3);
      stbi__zdefault_length[0xcc] = SUB81(stbi__zdefault_length._200_8_,4);
      stbi__zdefault_length[0xcd] = SUB81(stbi__zdefault_length._200_8_,5);
      stbi__zdefault_length[0xce] = SUB81(stbi__zdefault_length._200_8_,6);
      stbi__zdefault_length[0xcf] = SUB81(stbi__zdefault_length._200_8_,7);
      stbi__zdefault_length[0xd0] = (stbi_uc)stbi__zdefault_length._208_8_;
      stbi__zdefault_length[0xd1] = SUB81(stbi__zdefault_length._208_8_,1);
      stbi__zdefault_length[0xd2] = SUB81(stbi__zdefault_length._208_8_,2);
      stbi__zdefault_length[0xd3] = SUB81(stbi__zdefault_length._208_8_,3);
      stbi__zdefault_length[0xd4] = SUB81(stbi__zdefault_length._208_8_,4);
      stbi__zdefault_length[0xd5] = SUB81(stbi__zdefault_length._208_8_,5);
      stbi__zdefault_length[0xd6] = SUB81(stbi__zdefault_length._208_8_,6);
      stbi__zdefault_length[0xd7] = SUB81(stbi__zdefault_length._208_8_,7);
      stbi__zdefault_length[0xd8] = (stbi_uc)stbi__zdefault_length._216_8_;
      stbi__zdefault_length[0xd9] = SUB81(stbi__zdefault_length._216_8_,1);
      stbi__zdefault_length[0xda] = SUB81(stbi__zdefault_length._216_8_,2);
      stbi__zdefault_length[0xdb] = SUB81(stbi__zdefault_length._216_8_,3);
      stbi__zdefault_length[0xdc] = SUB81(stbi__zdefault_length._216_8_,4);
      stbi__zdefault_length[0xdd] = SUB81(stbi__zdefault_length._216_8_,5);
      stbi__zdefault_length[0xde] = SUB81(stbi__zdefault_length._216_8_,6);
      stbi__zdefault_length[0xdf] = SUB81(stbi__zdefault_length._216_8_,7);
      stbi__zdefault_length[0xe0] = (stbi_uc)stbi__zdefault_length._224_8_;
      stbi__zdefault_length[0xe1] = SUB81(stbi__zdefault_length._224_8_,1);
      stbi__zdefault_length[0xe2] = SUB81(stbi__zdefault_length._224_8_,2);
      stbi__zdefault_length[0xe3] = SUB81(stbi__zdefault_length._224_8_,3);
      stbi__zdefault_length[0xe4] = SUB81(stbi__zdefault_length._224_8_,4);
      stbi__zdefault_length[0xe5] = SUB81(stbi__zdefault_length._224_8_,5);
      stbi__zdefault_length[0xe6] = SUB81(stbi__zdefault_length._224_8_,6);
      stbi__zdefault_length[0xe7] = SUB81(stbi__zdefault_length._224_8_,7);
      stbi__zdefault_length[0xe8] = (stbi_uc)stbi__zdefault_length._232_8_;
      stbi__zdefault_length[0xe9] = SUB81(stbi__zdefault_length._232_8_,1);
      stbi__zdefault_length[0xea] = SUB81(stbi__zdefault_length._232_8_,2);
      stbi__zdefault_length[0xeb] = SUB81(stbi__zdefault_length._232_8_,3);
      stbi__zdefault_length[0xec] = SUB81(stbi__zdefault_length._232_8_,4);
      stbi__zdefault_length[0xed] = SUB81(stbi__zdefault_length._232_8_,5);
      stbi__zdefault_length[0xee] = SUB81(stbi__zdefault_length._232_8_,6);
      stbi__zdefault_length[0xef] = SUB81(stbi__zdefault_length._232_8_,7);
      stbi__zdefault_length[0xf0] = (stbi_uc)stbi__zdefault_length._240_8_;
      stbi__zdefault_length[0xf1] = SUB81(stbi__zdefault_length._240_8_,1);
      stbi__zdefault_length[0xf2] = SUB81(stbi__zdefault_length._240_8_,2);
      stbi__zdefault_length[0xf3] = SUB81(stbi__zdefault_length._240_8_,3);
      stbi__zdefault_length[0xf4] = SUB81(stbi__zdefault_length._240_8_,4);
      stbi__zdefault_length[0xf5] = SUB81(stbi__zdefault_length._240_8_,5);
      stbi__zdefault_length[0xf6] = SUB81(stbi__zdefault_length._240_8_,6);
      stbi__zdefault_length[0xf7] = SUB81(stbi__zdefault_length._240_8_,7);
      stbi__zdefault_length[0xf8] = (stbi_uc)stbi__zdefault_length._248_8_;
      stbi__zdefault_length[0xf9] = SUB81(stbi__zdefault_length._248_8_,1);
      stbi__zdefault_length[0xfa] = SUB81(stbi__zdefault_length._248_8_,2);
      stbi__zdefault_length[0xfb] = SUB81(stbi__zdefault_length._248_8_,3);
      stbi__zdefault_length[0xfc] = SUB81(stbi__zdefault_length._248_8_,4);
      stbi__zdefault_length[0xfd] = SUB81(stbi__zdefault_length._248_8_,5);
      stbi__zdefault_length[0xfe] = SUB81(stbi__zdefault_length._248_8_,6);
      stbi__zdefault_length[0xff] = SUB81(stbi__zdefault_length._248_8_,7);
      stbi__zdefault_length[0x100] = (stbi_uc)stbi__zdefault_length._256_8_;
      stbi__zdefault_length[0x101] = SUB81(stbi__zdefault_length._256_8_,1);
      stbi__zdefault_length[0x102] = SUB81(stbi__zdefault_length._256_8_,2);
      stbi__zdefault_length[0x103] = SUB81(stbi__zdefault_length._256_8_,3);
      stbi__zdefault_length[0x104] = SUB81(stbi__zdefault_length._256_8_,4);
      stbi__zdefault_length[0x105] = SUB81(stbi__zdefault_length._256_8_,5);
      stbi__zdefault_length[0x106] = SUB81(stbi__zdefault_length._256_8_,6);
      stbi__zdefault_length[0x107] = SUB81(stbi__zdefault_length._256_8_,7);
      stbi__zdefault_length[0x108] = (stbi_uc)stbi__zdefault_length._264_8_;
      stbi__zdefault_length[0x109] = SUB81(stbi__zdefault_length._264_8_,1);
      stbi__zdefault_length[0x10a] = SUB81(stbi__zdefault_length._264_8_,2);
      stbi__zdefault_length[0x10b] = SUB81(stbi__zdefault_length._264_8_,3);
      stbi__zdefault_length[0x10c] = SUB81(stbi__zdefault_length._264_8_,4);
      stbi__zdefault_length[0x10d] = SUB81(stbi__zdefault_length._264_8_,5);
      stbi__zdefault_length[0x10e] = SUB81(stbi__zdefault_length._264_8_,6);
      stbi__zdefault_length[0x10f] = SUB81(stbi__zdefault_length._264_8_,7);
      stbi__zdefault_length[0x110] = (stbi_uc)stbi__zdefault_length._272_8_;
      stbi__zdefault_length[0x111] = SUB81(stbi__zdefault_length._272_8_,1);
      stbi__zdefault_length[0x112] = SUB81(stbi__zdefault_length._272_8_,2);
      stbi__zdefault_length[0x113] = SUB81(stbi__zdefault_length._272_8_,3);
      stbi__zdefault_length[0x114] = SUB81(stbi__zdefault_length._272_8_,4);
      stbi__zdefault_length[0x115] = SUB81(stbi__zdefault_length._272_8_,5);
      stbi__zdefault_length[0x116] = SUB81(stbi__zdefault_length._272_8_,6);
      stbi__zdefault_length[0x117] = SUB81(stbi__zdefault_length._272_8_,7);
      stbi__zdefault_length[0x118] = (stbi_uc)stbi__zdefault_length._280_8_;
      stbi__zdefault_length[0x119] = SUB81(stbi__zdefault_length._280_8_,1);
      stbi__zdefault_length[0x11a] = SUB81(stbi__zdefault_length._280_8_,2);
      stbi__zdefault_length[0x11b] = SUB81(stbi__zdefault_length._280_8_,3);
      stbi__zdefault_length[0x11c] = SUB81(stbi__zdefault_length._280_8_,4);
      stbi__zdefault_length[0x11d] = SUB81(stbi__zdefault_length._280_8_,5);
      stbi__zdefault_length[0x11e] = SUB81(stbi__zdefault_length._280_8_,6);
      stbi__zdefault_length[0x11f] = SUB81(stbi__zdefault_length._280_8_,7);
      return 0;
    }
    pcVar20 = a->zout;
    while( true ) {
      while( true ) {
        if (a->num_bits < 0x10) {
          stbi__fill_bits(a);
        }
        uVar2 = a->code_buffer;
        uVar5 = (a->z_length).fast[uVar2 & 0x1ff];
        if (uVar5 == 0) {
          uVar5 = (ushort)uVar2 << 8 | (ushort)uVar2 >> 8;
          uVar8 = (uVar5 & 0xf0f) << 4 | (uVar5 & 0xf0f0) >> 4;
          uVar8 = (uVar8 >> 2 & 0x3333) + (uVar8 & 0x3333) * 4;
          uVar8 = (uVar8 >> 1 & 0x5555) + (uVar8 & 0x5555) * 2;
          lVar4 = 0;
          do {
            lVar11 = lVar4;
            lVar4 = lVar11 + 1;
          } while ((a->z_length).maxcode[lVar11 + 10] <= (int)uVar8);
          if (lVar4 == 7) goto LAB_00104b2f;
          lVar16 = (ulong)(a->z_length).firstsymbol[lVar11 + 10] +
                   ((ulong)(uVar8 >> (7U - (char)lVar4 & 0x1f)) -
                   (ulong)(a->z_length).firstcode[lVar11 + 10]);
          if ((ulong)*(byte *)((long)a + lVar16 + 0x4b8) - 9 != lVar4) goto LAB_00104b58;
          uVar2 = uVar2 >> ((char)lVar11 + 10U & 0x1f);
          a->code_buffer = uVar2;
          iVar9 = (a->num_bits - (int)lVar4) + -9;
          a->num_bits = iVar9;
          uVar8 = (uint)*(ushort *)((long)a + lVar16 * 2 + 0x5d8);
        }
        else {
          uVar2 = uVar2 >> ((byte)(uVar5 >> 9) & 0x1f);
          a->code_buffer = uVar2;
          iVar9 = a->num_bits - (uint)(uVar5 >> 9);
          a->num_bits = iVar9;
          uVar8 = uVar5 & 0x1ff;
        }
        if (0xff < uVar8) break;
        if (a->zout_end <= pcVar20) {
          iVar9 = stbi__zexpand(a,pcVar20,1);
          if (iVar9 == 0) {
            return 0;
          }
          pcVar20 = a->zout;
        }
        *pcVar20 = (char)uVar8;
        pcVar20 = pcVar20 + 1;
      }
      if (uVar8 == 0x100) break;
      uVar22 = (ulong)(uVar8 - 0x101);
      uVar8 = stbi__zlength_base[uVar22];
      if (0xffffffffffffffeb < uVar22 - 0x1c) {
        iVar3 = stbi__zlength_extra[uVar22];
        if (iVar9 < iVar3) {
          stbi__fill_bits(a);
          iVar9 = a->num_bits;
          uVar2 = a->code_buffer;
        }
        uVar19 = ~(-1 << ((byte)iVar3 & 0x1f)) & uVar2;
        uVar2 = uVar2 >> ((byte)iVar3 & 0x1f);
        a->code_buffer = uVar2;
        iVar9 = iVar9 - iVar3;
        a->num_bits = iVar9;
        uVar8 = uVar8 + uVar19;
      }
      if (iVar9 < 0x10) {
        stbi__fill_bits(a);
        uVar2 = a->code_buffer;
      }
      uVar5 = z->fast[uVar2 & 0x1ff];
      if (uVar5 == 0) {
        uVar5 = (ushort)uVar2 << 8 | (ushort)uVar2 >> 8;
        uVar19 = (uVar5 & 0xf0f) << 4 | (uVar5 & 0xf0f0) >> 4;
        uVar19 = (uVar19 >> 2 & 0x3333) + (uVar19 & 0x3333) * 4;
        uVar19 = (uVar19 >> 1 & 0x5555) + (uVar19 & 0x5555) * 2;
        lVar4 = 0;
        do {
          lVar11 = lVar4;
          lVar4 = lVar11 + 1;
        } while ((a->z_distance).maxcode[lVar11 + 10] <= (int)uVar19);
        if (lVar4 == 7) goto LAB_00104b2f;
        lVar16 = (ulong)(a->z_distance).firstsymbol[lVar11 + 10] +
                 ((ulong)(uVar19 >> (7U - (char)lVar4 & 0x1f)) -
                 (ulong)(a->z_distance).firstcode[lVar11 + 10]);
        if ((ulong)*(byte *)((long)a + lVar16 + 0xc9c) - 9 != lVar4) {
LAB_00104b58:
          __assert_fail("z->size[b] == s",
                        "/workspace/llm4binary/github/license_c_cmakelists/RayTracing[P]raytracing/src/external/stb_image.h"
                        ,0xdf5,"int stbi__zhuffman_decode_slowpath(stbi__zbuf *, stbi__zhuffman *)")
          ;
        }
        uVar2 = uVar2 >> ((char)lVar11 + 10U & 0x1f);
        a->code_buffer = uVar2;
        iVar9 = (a->num_bits - (int)lVar4) + -9;
        a->num_bits = iVar9;
        uVar19 = (uint)*(ushort *)((long)a + lVar16 * 2 + 0xdbc);
      }
      else {
        uVar2 = uVar2 >> ((byte)(uVar5 >> 9) & 0x1f);
        a->code_buffer = uVar2;
        iVar9 = a->num_bits - (uint)(uVar5 >> 9);
        a->num_bits = iVar9;
        uVar19 = uVar5 & 0x1ff;
      }
      uVar22 = (ulong)uVar19;
      iVar3 = stbi__zdist_base[uVar22];
      if (0xffffffffffffffe5 < uVar22 - 0x1e) {
        iVar13 = stbi__zdist_extra[uVar22];
        if (iVar9 < iVar13) {
          stbi__fill_bits(a);
          iVar9 = a->num_bits;
          uVar2 = a->code_buffer;
        }
        a->code_buffer = uVar2 >> ((byte)iVar13 & 0x1f);
        a->num_bits = iVar9 - iVar13;
        iVar3 = iVar3 + (~(-1 << ((byte)iVar13 & 0x1f)) & uVar2);
      }
      if ((long)pcVar20 - (long)a->zout_start < (long)iVar3) goto LAB_00104b2f;
      if (a->zout_end < pcVar20 + (int)uVar8) {
        iVar9 = stbi__zexpand(a,pcVar20,uVar8);
        if (iVar9 == 0) {
          return 0;
        }
        pcVar20 = a->zout;
      }
      lVar4 = -(long)iVar3;
      if (iVar3 == 1) {
        if (uVar8 != 0) {
          memset(pcVar20,(uint)(byte)pcVar20[lVar4],(ulong)uVar8);
          pcVar20 = pcVar20 + (ulong)(uVar8 - 1) + 1;
        }
      }
      else {
        for (; uVar8 != 0; uVar8 = uVar8 - 1) {
          *pcVar20 = pcVar20[lVar4];
          pcVar20 = pcVar20 + 1;
        }
      }
    }
    a->zout = pcVar20;
LAB_00104b19:
    if ((uVar6 & 1) != 0) {
      return 1;
    }
    iVar9 = a->num_bits;
  } while( true );
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}